

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void avg_nmv(nmv_context *nmv_left,nmv_context *nmv_tr,int wt_left,int wt_tr)

{
  int iVar1;
  nmv_component *pnVar2;
  aom_cdf_prob (*paaVar3) [5];
  aom_cdf_prob (*paaVar4) [3];
  aom_cdf_prob *paVar5;
  aom_cdf_prob (*paaVar6) [3];
  aom_cdf_prob (*paaVar7) [3];
  long lVar8;
  aom_cdf_prob (*paaVar9) [5];
  aom_cdf_prob (*paaVar10) [3];
  int iVar11;
  int j;
  long lVar12;
  nmv_component *pnVar13;
  long lVar14;
  aom_cdf_prob *paVar15;
  aom_cdf_prob *paVar16;
  int i;
  aom_cdf_prob (*paaVar17) [5];
  aom_cdf_prob *paVar18;
  bool bVar19;
  aom_cdf_prob *local_98;
  aom_cdf_prob *local_90;
  aom_cdf_prob *local_88;
  aom_cdf_prob *local_80;
  aom_cdf_prob *local_78;
  aom_cdf_prob *local_70;
  aom_cdf_prob (*local_68) [5];
  
  iVar1 = wt_tr + wt_left;
  iVar11 = iVar1 / 2;
  lVar12 = 0;
  do {
    nmv_left->joints_cdf[lVar12] =
         (aom_cdf_prob)
         ((int)((uint)nmv_left->joints_cdf[lVar12] * wt_left + iVar11 +
               (uint)nmv_tr->joints_cdf[lVar12] * wt_tr) / iVar1);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  pnVar13 = nmv_left->comps;
  pnVar2 = nmv_tr->comps;
  paaVar17 = nmv_tr->comps[0].class0_fp_cdf;
  local_68 = nmv_left->comps[0].class0_fp_cdf;
  local_98 = nmv_left->comps[0].fp_cdf;
  local_70 = nmv_tr->comps[0].fp_cdf;
  paVar5 = nmv_left->comps[0].sign_cdf;
  local_78 = nmv_tr->comps[0].sign_cdf;
  paVar18 = nmv_left->comps[0].class0_hp_cdf;
  local_80 = nmv_tr->comps[0].class0_hp_cdf;
  paVar15 = nmv_left->comps[0].hp_cdf;
  local_88 = nmv_tr->comps[0].hp_cdf;
  paVar16 = nmv_left->comps[0].class0_cdf;
  local_90 = nmv_tr->comps[0].class0_cdf;
  paaVar6 = nmv_tr->comps[0].bits_cdf;
  paaVar7 = nmv_left->comps[0].bits_cdf;
  lVar12 = 0;
  do {
    lVar8 = 0;
    do {
      pnVar13->classes_cdf[lVar8] =
           (aom_cdf_prob)
           ((int)((uint)pnVar13->classes_cdf[lVar8] * wt_left + iVar11 +
                 (uint)pnVar2->classes_cdf[lVar8] * wt_tr) / iVar1);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xc);
    lVar8 = 0;
    paaVar3 = local_68;
    paaVar9 = paaVar17;
    do {
      lVar14 = 0;
      do {
        (*paaVar3)[lVar14] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar3)[lVar14] * wt_left + iVar11 + (uint)(*paaVar9)[lVar14] * wt_tr)
             / iVar1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 5);
      lVar8 = lVar8 + 1;
      paaVar9 = paaVar9 + 1;
      paaVar3 = paaVar3 + 1;
    } while (lVar8 != 2);
    lVar8 = 0;
    do {
      local_98[lVar8] =
           (aom_cdf_prob)
           ((int)((uint)local_98[lVar8] * wt_left + iVar11 + (uint)local_70[lVar8] * wt_tr) / iVar1)
      ;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    lVar8 = 0;
    do {
      paVar5[lVar8] =
           (aom_cdf_prob)
           ((int)((uint)paVar5[lVar8] * wt_left + iVar11 + (uint)local_78[lVar8] * wt_tr) / iVar1);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      paVar18[lVar8] =
           (aom_cdf_prob)
           ((int)((uint)paVar18[lVar8] * wt_left + iVar11 + (uint)local_80[lVar8] * wt_tr) / iVar1);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      paVar15[lVar8] =
           (aom_cdf_prob)
           ((int)((uint)paVar15[lVar8] * wt_left + iVar11 + (uint)local_88[lVar8] * wt_tr) / iVar1);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      paVar16[lVar8] =
           (aom_cdf_prob)
           ((int)((uint)paVar16[lVar8] * wt_left + iVar11 + (uint)local_90[lVar8] * wt_tr) / iVar1);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    paaVar4 = paaVar7;
    paaVar10 = paaVar6;
    do {
      lVar14 = 0;
      do {
        (*paaVar4)[lVar14] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar4)[lVar14] * wt_left + iVar11 + (uint)(*paaVar10)[lVar14] * wt_tr)
             / iVar1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      lVar8 = lVar8 + 1;
      paaVar10 = paaVar10 + 1;
      paaVar4 = paaVar4 + 1;
    } while (lVar8 != 10);
    pnVar13 = pnVar13 + 1;
    pnVar2 = pnVar2 + 1;
    paaVar17 = (aom_cdf_prob (*) [5])((long)(paaVar17 + 0xd) + 8);
    local_68 = (aom_cdf_prob (*) [5])((long)(local_68 + 0xd) + 8);
    local_98 = local_98 + 0x45;
    local_70 = local_70 + 0x45;
    paVar5 = paVar5 + 0x45;
    local_78 = local_78 + 0x45;
    paVar18 = paVar18 + 0x45;
    local_80 = local_80 + 0x45;
    paVar15 = paVar15 + 0x45;
    local_88 = local_88 + 0x45;
    paVar16 = paVar16 + 0x45;
    local_90 = local_90 + 0x45;
    paaVar6 = paaVar6 + 0x17;
    paaVar7 = paaVar7 + 0x17;
    bVar19 = lVar12 == 0;
    lVar12 = lVar12 + 1;
  } while (bVar19);
  return;
}

Assistant:

static void avg_nmv(nmv_context *nmv_left, nmv_context *nmv_tr, int wt_left,
                    int wt_tr) {
  AVERAGE_CDF(nmv_left->joints_cdf, nmv_tr->joints_cdf, 4);
  for (int i = 0; i < 2; i++) {
    AVERAGE_CDF(nmv_left->comps[i].classes_cdf, nmv_tr->comps[i].classes_cdf,
                MV_CLASSES);
    AVERAGE_CDF(nmv_left->comps[i].class0_fp_cdf,
                nmv_tr->comps[i].class0_fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].fp_cdf, nmv_tr->comps[i].fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].sign_cdf, nmv_tr->comps[i].sign_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_hp_cdf,
                nmv_tr->comps[i].class0_hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].hp_cdf, nmv_tr->comps[i].hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_cdf, nmv_tr->comps[i].class0_cdf,
                CLASS0_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].bits_cdf, nmv_tr->comps[i].bits_cdf, 2);
  }
}